

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redexpress.cpp
# Opt level: O2

void checkOptions(Options *opts,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_5a;
  allocator local_59;
  string typestring;
  string local_38;
  
  std::__cxx11::string::string((string *)&typestring,"t|type=s:redwelte",&local_5a);
  std::__cxx11::string::string((string *)&local_38,"type of roll to process",&local_59);
  smf::Options::define(opts,&typestring,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&typestring);
  std::__cxx11::string::string((string *)&typestring,"t100|T100=b",&local_5a);
  std::__cxx11::string::string
            ((string *)&local_38,"red Welte-Mignon roll, 100 tracker holes",&local_59);
  smf::Options::define(opts,&typestring,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&typestring);
  std::__cxx11::string::string((string *)&typestring,"author=b",&local_5a);
  std::__cxx11::string::string((string *)&local_38,"author of program",&local_59);
  smf::Options::define(opts,&typestring,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&typestring);
  std::__cxx11::string::string((string *)&typestring,"version=b",&local_5a);
  std::__cxx11::string::string((string *)&local_38,"compilation info",&local_59);
  smf::Options::define(opts,&typestring,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&typestring);
  std::__cxx11::string::string((string *)&typestring,"example=b",&local_5a);
  std::__cxx11::string::string((string *)&local_38,"example usages",&local_59);
  smf::Options::define(opts,&typestring,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&typestring);
  std::__cxx11::string::string((string *)&typestring,"h|help=b",&local_5a);
  std::__cxx11::string::string((string *)&local_38,"short description",&local_59);
  smf::Options::define(opts,&typestring,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&typestring);
  smf::Options::process(opts,argc,argv,1,0);
  std::__cxx11::string::string((string *)&typestring,"author",(allocator *)&local_38);
  bVar1 = smf::Options::getBoolean(opts,&typestring);
  std::__cxx11::string::~string((string *)&typestring);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    pcVar4 = "craig@ccrma.stanford.edu, 24 February 2018";
  }
  else {
    std::__cxx11::string::string((string *)&typestring,"version",(allocator *)&local_38);
    bVar1 = smf::Options::getBoolean(opts,&typestring);
    std::__cxx11::string::~string((string *)&typestring);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&typestring,"help",(allocator *)&local_38);
      bVar1 = smf::Options::getBoolean(opts,&typestring);
      std::__cxx11::string::~string((string *)&typestring);
      if (bVar1) {
        smf::Options::getCommand_abi_cxx11_(&typestring,opts);
        std::__cxx11::string::~string((string *)&typestring);
      }
      else {
        std::__cxx11::string::string((string *)&typestring,"example",(allocator *)&local_38);
        bVar1 = smf::Options::getBoolean(opts,&typestring);
        std::__cxx11::string::~string((string *)&typestring);
        if (!bVar1) {
          iVar2 = smf::Options::getArgCount(opts);
          if (iVar2 < 3) {
            Rolltype = 1;
            std::__cxx11::string::string((string *)&typestring,"type",(allocator *)&local_38);
            bVar1 = smf::Options::getBoolean(opts,&typestring);
            std::__cxx11::string::~string((string *)&typestring);
            if (bVar1) {
              std::__cxx11::string::string((string *)&local_38,"type",&local_5a);
              smf::Options::getString(&typestring,opts,&local_38);
              std::__cxx11::string::~string((string *)&local_38);
              bVar1 = std::operator==(&typestring,"redwelte");
              if (((bVar1) || (bVar1 = std::operator==(&typestring,"t100"), bVar1)) ||
                 (bVar1 = std::operator==(&typestring,"T100"), bVar1)) {
                Rolltype = 1;
              }
              std::__cxx11::string::~string((string *)&typestring);
            }
            else {
              std::__cxx11::string::string((string *)&typestring,"T100",(allocator *)&local_38);
              bVar1 = smf::Options::getBoolean(opts,&typestring);
              std::__cxx11::string::~string((string *)&typestring);
              if (bVar1) {
                Rolltype = 1;
                return;
              }
            }
            if (Rolltype == 1) {
              return;
            }
            poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown roll type");
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          else {
            smf::Options::getCommand_abi_cxx11_(&typestring,opts);
            std::__cxx11::string::~string((string *)&typestring);
          }
          exit(1);
        }
      }
      goto LAB_00116e1c;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,*argv);
    poVar3 = std::operator<<(poVar3,", version: February 2018");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"compiled: ");
    pcVar4 = "Apr 26 2025";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00116e1c:
  exit(0);
}

Assistant:

void checkOptions(Options& opts, int argc, char* argv[]) {
	opts.define("t|type=s:redwelte",  "type of roll to process");
	opts.define("t100|T100=b", "red Welte-Mignon roll, 100 tracker holes");

	opts.define("author=b",  "author of program");
	opts.define("version=b", "compilation info");
	opts.define("example=b", "example usages");
	opts.define("h|help=b",  "short description");
	opts.process(argc, argv);

	// handle basic options:
	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
			  << "craig@ccrma.stanford.edu, 24 February 2018" << endl;
		exit(0);
	} else if (opts.getBoolean("version")) {
		cout << argv[0] << ", version: February 2018" << endl;
		cout << "compiled: " << __DATE__ << endl;
		exit(0);
	} else if (opts.getBoolean("help")) {
		usage(opts.getCommand().data());
		exit(0);
	} else if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	if (opts.getArgCount() > 2) {
		usage(opts.getCommand().data());
		exit(1);
	}

	Rolltype = TYPE_T100;
	if (opts.getBoolean("type")) {
		string typestring = opts.getString("type");
		if (typestring == "redwelte") {
			Rolltype = TYPE_T100;
		} else if (typestring == "t100") {
			Rolltype = TYPE_T100;
		} else if (typestring == "T100") {
			Rolltype = TYPE_T100;
		}
	} else if (opts.getBoolean("T100")) {
		Rolltype = TYPE_T100;
	}

	if (Rolltype != TYPE_T100) {
		cerr << "Unknown roll type" << endl;
		exit(1);
	}
}